

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldatabase.cpp
# Opt level: O1

void QSqlDatabasePrivate::removeDatabase(QString *name)

{
  Data<QHashPrivate::Node<QString,_QSqlDatabase>_> *this;
  char cVar1;
  Type *pTVar2;
  Node<QString,_QSqlDatabase> *pNVar3;
  QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
  *this_00;
  Type *pTVar4;
  long in_FS_OFFSET;
  QDeadlineTimer QVar5;
  QSqlDatabase local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
             *)name;
  cVar1 = QCoreApplication::instanceExists();
  if (cVar1 == '\0') {
    removeDatabase();
  }
  else {
    pTVar2 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
             ::operator()(this_00);
    pTVar4 = pTVar2;
    if (((ulong)pTVar2 & 1) == 0 && pTVar2 != (Type *)0x0) {
      QVar5.t2 = 0xffffffff;
      QVar5.type = 0x7fffffff;
      QVar5.t1 = (qint64)pTVar2;
      QReadWriteLock::tryLockForWrite(QVar5);
      pTVar4 = (Type *)((ulong)pTVar2 | 1);
    }
    this = (pTVar2->connections).d;
    if (this != (Data<QHashPrivate::Node<QString,_QSqlDatabase>_> *)0x0) {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QString,_QSqlDatabase>_>::findNode<QString>
                         (this,name);
      if (pNVar3 != (Node<QString,_QSqlDatabase> *)0x0) {
        QHash<QString,_QSqlDatabase>::takeImpl<QString>
                  ((QHash<QString,_QSqlDatabase> *)&local_30,(QString *)&pTVar2->connections);
        invalidateDb(&local_30,name,true);
        QSqlDatabase::~QSqlDatabase(&local_30);
      }
    }
    if (((ulong)pTVar4 & 1) != 0) {
      QReadWriteLock::unlock();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlDatabasePrivate::removeDatabase(const QString &name)
{
    CHECK_QCOREAPPLICATION
    QtSqlGlobals *sqlGlobals = s_sqlGlobals();
    QWriteLocker locker(&sqlGlobals->lock);

    if (!sqlGlobals->connections.contains(name))
        return;

    invalidateDb(sqlGlobals->connections.take(name), name);
}